

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

char * transform_xml2json(ly_ctx *ctx,char *expr,lyxml_elem *xml,int use_ctx_data_clb,int log)

{
  size_t sVar1;
  LY_ERR *pLVar2;
  lyxp_expr *expr_00;
  char *s;
  char *pcVar3;
  char *pcVar4;
  lyxml_ns *plVar5;
  size_t sVar6;
  ushort **ppuVar7;
  lys_module *plVar8;
  bool bVar9;
  lyxp_expr *exp;
  lyxml_ns *ns;
  lys_module *mod;
  size_t pref_len;
  size_t out_used;
  size_t out_size;
  uint16_t i;
  char *prefix;
  char *out;
  char *ptr;
  char *cur_expr;
  char *end;
  int log_local;
  int use_ctx_data_clb_local;
  lyxml_elem *xml_local;
  char *expr_local;
  ly_ctx *ctx_local;
  
  sVar1 = strlen(expr);
  out_used = sVar1 + 1;
  prefix = (char *)malloc(out_used);
  if (prefix == (char *)0x0) {
    if (log != 0) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_xml2json");
    }
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    pref_len = 0;
    expr_00 = lyxp_parse_expr(expr);
    if (expr_00 == (lyxp_expr *)0x0) {
      free(prefix);
      ctx_local = (ly_ctx *)0x0;
    }
    else {
      for (out_size._6_2_ = 0; out_size._6_2_ < expr_00->used; out_size._6_2_ = out_size._6_2_ + 1)
      {
        s = expr_00->expr + expr_00->expr_pos[out_size._6_2_];
        if ((out_size._6_2_ != 0) &&
           (pcVar3 = expr_00->expr +
                     (long)(int)(uint)expr_00->tok_len[(int)(out_size._6_2_ - 1)] +
                     (long)(int)(uint)expr_00->expr_pos[(int)(out_size._6_2_ - 1)], pcVar3 != s)) {
          strncpy(prefix + pref_len,pcVar3,(long)s - (long)pcVar3);
          pref_len = (size_t)(s + (pref_len - (long)pcVar3));
        }
        if ((expr_00->tokens[out_size._6_2_] == LYXP_TOKEN_NAMETEST) &&
           (pcVar3 = strnchr(s,0x3a,(uint)expr_00->tok_len[out_size._6_2_]), pcVar3 != (char *)0x0))
        {
          sVar1 = (long)pcVar3 - (long)s;
          pcVar4 = strndup(s,sVar1);
          if (pcVar4 == (char *)0x0) {
            if (log != 0) {
              pLVar2 = ly_errno_location();
              *pLVar2 = LY_EMEM;
              ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_xml2json");
            }
LAB_0010f5f4:
            free(prefix);
            lyxp_expr_free(expr_00);
            return (char *)0x0;
          }
          plVar5 = lyxml_get_ns(xml,pcVar4);
          free(pcVar4);
          if (plVar5 == (lyxml_ns *)0x0) {
            if (log != 0) {
              ly_vlog(LYE_XML_INVAL,LY_VLOG_XML,xml,"namespace prefix");
              ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                      "XML namespace with prefix \"%.*s\" not defined.",sVar1,s);
            }
            goto LAB_0010f5f4;
          }
          ns = (lyxml_ns *)ly_ctx_get_module_by_ns(ctx,plVar5->value,(char *)0x0);
          if ((use_ctx_data_clb != 0) && (ctx->data_clb != (ly_module_data_clb)0x0)) {
            if ((lys_module *)ns == (lys_module *)0x0) {
              ns = (lyxml_ns *)(*ctx->data_clb)(ctx,(char *)0x0,plVar5->value,0,ctx->data_clb_data);
            }
            else if (-1 < (char)((lys_module *)ns)->field_0x40) {
              ns = (lyxml_ns *)
                   (*ctx->data_clb)(ctx,((lys_module *)ns)->name,((lys_module *)ns)->ns,1,
                                    ctx->data_clb_data);
            }
          }
          if (ns == (lyxml_ns *)0x0) {
            if (log != 0) {
              ly_vlog(LYE_XML_INVAL,LY_VLOG_XML,xml,"module namespace");
              ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                      "Module with the namespace \"%s\" could not be found.",plVar5->value);
            }
            goto LAB_0010f5f4;
          }
          sVar6 = strlen((char *)ns->next);
          out_used = (sVar6 - sVar1) + out_used;
          prefix = (char *)ly_realloc(prefix,out_used);
          if (prefix == (char *)0x0) {
            if (log != 0) {
              pLVar2 = ly_errno_location();
              *pLVar2 = LY_EMEM;
              ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_xml2json");
            }
            goto LAB_0010f5f4;
          }
          strcpy(prefix + pref_len,(char *)ns->next);
          sVar6 = strlen((char *)ns->next);
          strncpy(prefix + sVar6 + pref_len,pcVar3,expr_00->tok_len[out_size._6_2_] - sVar1);
          pref_len = (expr_00->tok_len[out_size._6_2_] - sVar1) + sVar6 + pref_len;
        }
        else if ((expr_00->tokens[out_size._6_2_] == LYXP_TOKEN_LITERAL) &&
                (pcVar3 = strnchr(s,0x3a,(uint)expr_00->tok_len[out_size._6_2_]), out = pcVar3,
                pcVar3 != (char *)0x0)) {
          while( true ) {
            ppuVar7 = __ctype_b_loc();
            bVar9 = true;
            if (((((*ppuVar7)[(int)out[-1]] & 8) == 0) && (bVar9 = true, out[-1] != '_')) &&
               (bVar9 = true, out[-1] != '-')) {
              bVar9 = out[-1] == '.';
            }
            if (!bVar9) break;
            out = out + -1;
          }
          sVar1 = (long)pcVar3 - (long)s;
          pcVar4 = strndup(s,sVar1);
          if (pcVar4 == (char *)0x0) {
            if (log != 0) {
              pLVar2 = ly_errno_location();
              *pLVar2 = LY_EMEM;
              ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_xml2json");
            }
            goto LAB_0010f5f4;
          }
          plVar5 = lyxml_get_ns(xml,pcVar4);
          free(pcVar4);
          if (plVar5 == (lyxml_ns *)0x0) {
            if (log != 0) {
              ly_vlog(LYE_XML_INVAL,LY_VLOG_XML,xml,"namespace prefix");
              ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                      "XML namespace with prefix \"%.*s\" not defined.",sVar1,s);
            }
            goto LAB_0010f5f4;
          }
          plVar8 = ly_ctx_get_module_by_ns(ctx,plVar5->value,(char *)0x0);
          if (plVar8 == (lys_module *)0x0) {
            strncpy(prefix + pref_len,expr_00->expr + expr_00->expr_pos[out_size._6_2_],
                    (ulong)expr_00->tok_len[out_size._6_2_]);
            pref_len = expr_00->tok_len[out_size._6_2_] + pref_len;
          }
          else {
            sVar6 = strlen(plVar8->name);
            out_used = (sVar6 - sVar1) + out_used;
            prefix = (char *)ly_realloc(prefix,out_used);
            if (prefix == (char *)0x0) {
              if (log != 0) {
                pLVar2 = ly_errno_location();
                *pLVar2 = LY_EMEM;
                ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_xml2json");
              }
              goto LAB_0010f5f4;
            }
            strncpy(prefix + pref_len,s,(long)out - (long)s);
            pcVar4 = out + (pref_len - (long)s);
            strcpy(prefix + (long)pcVar4,plVar8->name);
            sVar6 = strlen(plVar8->name);
            strncpy(prefix + (long)(pcVar4 + sVar6),pcVar3,
                    (expr_00->tok_len[out_size._6_2_] - sVar1) - ((long)out - (long)s));
            pref_len = (size_t)(pcVar4 + sVar6 +
                               ((expr_00->tok_len[out_size._6_2_] - sVar1) - ((long)out - (long)s)))
            ;
          }
        }
        else {
          strncpy(prefix + pref_len,expr_00->expr + expr_00->expr_pos[out_size._6_2_],
                  (ulong)expr_00->tok_len[out_size._6_2_]);
          pref_len = expr_00->tok_len[out_size._6_2_] + pref_len;
        }
      }
      prefix[pref_len] = '\0';
      lyxp_expr_free(expr_00);
      ctx_local = (ly_ctx *)lydict_insert_zc(ctx,prefix);
    }
  }
  return (char *)ctx_local;
}

Assistant:

const char *
transform_xml2json(struct ly_ctx *ctx, const char *expr, struct lyxml_elem *xml, int use_ctx_data_clb, int log)
{
    const char *end, *cur_expr, *ptr;
    char *out, *prefix;
    uint16_t i;
    size_t out_size, out_used, pref_len;
    const struct lys_module *mod;
    const struct lyxml_ns *ns;
    struct lyxp_expr *exp;

    out_size = strlen(expr) + 1;
    out = malloc(out_size);
    if (!out) {
        if (log) {
            LOGMEM;
        }
        return NULL;
    }
    out_used = 0;

    exp = lyxp_parse_expr(expr);
    if (!exp) {
        free(out);
        return NULL;
    }

    for (i = 0; i < exp->used; ++i) {
        cur_expr = &exp->expr[exp->expr_pos[i]];

        /* copy WS */
        if (i && ((end = exp->expr + exp->expr_pos[i - 1] + exp->tok_len[i - 1]) != cur_expr)) {
            strncpy(&out[out_used], end, cur_expr - end);
            out_used += cur_expr - end;
        }

        if ((exp->tokens[i] == LYXP_TOKEN_NAMETEST) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            /* get the module */
            pref_len = end - cur_expr;
            prefix = strndup(cur_expr, pref_len);
            if (!prefix) {
                if (log) {
                    LOGMEM;
                }
                goto error;
            }
            ns = lyxml_get_ns(xml, prefix);
            free(prefix);
            if (!ns) {
                if (log) {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_XML, xml, "namespace prefix");
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL,
                        "XML namespace with prefix \"%.*s\" not defined.", pref_len, cur_expr);
                }
                goto error;
            }
            mod = ly_ctx_get_module_by_ns(ctx, ns->value, NULL);
            if (use_ctx_data_clb && ctx->data_clb) {
                if (!mod) {
                    mod = ctx->data_clb(ctx, NULL, ns->value, 0, ctx->data_clb_data);
                } else if (!mod->implemented) {
                    mod = ctx->data_clb(ctx, mod->name, mod->ns, LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
                }
            }
            if (!mod) {
                if (log) {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_XML, xml, "module namespace");
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL,
                        "Module with the namespace \"%s\" could not be found.", ns->value);
                }
                goto error;
            }

            /* adjust out size (it can even decrease in some strange cases) */
            out_size += strlen(mod->name) - pref_len;
            out = ly_realloc(out, out_size);
            if (!out) {
                if (log) {
                    LOGMEM;
                }
                goto error;
            }

            /* copy the model name */
            strcpy(&out[out_used], mod->name);
            out_used += strlen(mod->name);

            /* copy the rest */
            strncpy(&out[out_used], end, exp->tok_len[i] - pref_len);
            out_used += exp->tok_len[i] - pref_len;
        } else if ((exp->tokens[i] == LYXP_TOKEN_LITERAL) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            ptr = end;
            while (isalnum(ptr[-1]) || (ptr[-1] == '_') || (ptr[-1] == '-') || (ptr[-1] == '.')) {
                --ptr;
            }

            /* get the module */
            pref_len = end - cur_expr;
            prefix = strndup(cur_expr, pref_len);
            if (!prefix) {
                if (log) {
                    LOGMEM;
                }
                goto error;
            }
            ns = lyxml_get_ns(xml, prefix);
            free(prefix);
            if (!ns) {
                if (log) {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_XML, xml, "namespace prefix");
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL,
                        "XML namespace with prefix \"%.*s\" not defined.", pref_len, cur_expr);
                }
                goto error;
            }
            mod = ly_ctx_get_module_by_ns(ctx, ns->value, NULL);
            if (mod) {
                /* adjust out size (it can even decrease in some strange cases) */
                out_size += strlen(mod->name) - pref_len;
                out = ly_realloc(out, out_size);
                if (!out) {
                    if (log) {
                        LOGMEM;
                    }
                    goto error;
                }

                /* copy any beginning */
                strncpy(&out[out_used], cur_expr, ptr - cur_expr);
                out_used += ptr - cur_expr;

                /* copy the model name */
                strcpy(&out[out_used], mod->name);
                out_used += strlen(mod->name);

                /* copy the rest */
                strncpy(&out[out_used], end, (exp->tok_len[i] - pref_len) - (ptr - cur_expr));
                out_used += (exp->tok_len[i] - pref_len) - (ptr - cur_expr);
            } else {
                strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
                out_used += exp->tok_len[i];
            }
        } else {
            strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
            out_used += exp->tok_len[i];
        }
    }
    out[out_used] = '\0';

    lyxp_expr_free(exp);
    return lydict_insert_zc(ctx, out);

error:
    free(out);
    lyxp_expr_free(exp);
    return NULL;
}